

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
begin_array(basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
           json_visitor *visitor,error_code *ec)

{
  uint uVar1;
  bson_errc __e;
  type_conflict4 length;
  uint8_t buf [4];
  size_t n;
  int local_30;
  int local_2c;
  unsigned_long local_28;
  parse_mode local_1c;
  
  uVar1 = (int)((ulong)((long)(this->state_stack_).
                              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->state_stack_).
                             super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
  if (*(int *)((this->options_)._vptr_bson_decode_options[-3] + 8 +
              (long)&(this->options_)._vptr_bson_decode_options) < (int)uVar1) {
    __e = max_nesting_depth_exceeded;
  }
  else {
    local_28 = stream_source<unsigned_char>::read
                         (&this->source_,(int)&local_2c,(void *)0x4,(ulong)uVar1);
    if (local_28 == 4) {
      local_30 = local_2c;
      (*visitor->_vptr_basic_json_visitor[6])(visitor,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      if (ec->_M_value != 0) {
        return;
      }
      local_1c = array;
      std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
      emplace_back<jsoncons::bson::parse_mode,int&,unsigned_long&>
                ((vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>> *)
                 &this->state_stack_,&local_1c,&local_30,&local_28);
      return;
    }
    __e = unexpected_eof;
  }
  std::error_code::operator=(ec,__e);
  this->more_ = false;
  return;
}

Assistant:

void begin_array(json_visitor& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(static_cast<int>(state_stack_.size()) > options_.max_nesting_depth()))
        {
            ec = bson_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 
        uint8_t buf[sizeof(int32_t)]; 
        std::size_t n = source_.read(buf, sizeof(int32_t));
        if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        auto length = binary::little_to_native<int32_t>(buf, sizeof(buf));

        visitor.begin_array(semantic_tag::none, *this, ec);
        more_ = !cursor_mode_;
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        state_stack_.emplace_back(parse_mode::array, length, n);
    }